

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O2

void __thiscall
glslang::HlslParseContext::fixConstInit
          (HlslParseContext *this,TSourceLoc *loc,TString *identifier,TType *type,
          TIntermTyped **initializer)

{
  _func_int *UNRECOVERED_JUMPTABLE;
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  TIntermAggregate *pTVar2;
  
  if (*initializer != (TIntermTyped *)0x0) {
    return;
  }
  iVar1 = (*type->_vptr_TType[10])(type);
  if (((*(uint *)(CONCAT44(extraout_var,iVar1) + 8) & 0x7f) != 2) &&
     (iVar1 = (*type->_vptr_TType[10])(type),
     (*(uint *)(CONCAT44(extraout_var_00,iVar1) + 8) & 0x7f) != 0x13)) {
    return;
  }
  pTVar2 = TIntermediate::makeAggregate
                     ((this->super_TParseContextBase).super_TParseVersions.intermediate,loc);
  *initializer = (TIntermTyped *)pTVar2;
  UNRECOVERED_JUMPTABLE =
       (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2e];
  (*UNRECOVERED_JUMPTABLE)
            (this,loc,"variable with qualifier \'const\' not initialized; zero initializing",
             (identifier->_M_dataplus)._M_p,"",UNRECOVERED_JUMPTABLE);
  return;
}

Assistant:

void HlslParseContext::fixConstInit(const TSourceLoc& loc, const TString& identifier, TType& type,
                                    TIntermTyped*& initializer)
{
    //
    // Make the qualifier make sense, given that there is an initializer.
    //
    if (initializer == nullptr) {
        if (type.getQualifier().storage == EvqConst ||
            type.getQualifier().storage == EvqConstReadOnly) {
            initializer = intermediate.makeAggregate(loc);
            warn(loc, "variable with qualifier 'const' not initialized; zero initializing", identifier.c_str(), "");
        }
    }
}